

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorBG.cpp
# Opt level: O1

AlphaVector * __thiscall
AlphaVectorBG::BeliefBackupExhaustiveStoreAll
          (AlphaVector *__return_storage_ptr__,AlphaVectorBG *this,JointBeliefInterface *b,Index a,
          GaoVectorSet *G,ValueFunctionPOMDPDiscrete *V)

{
  int *piVar1;
  undefined1 auVar2 [16];
  long *plVar3;
  sp_counted_base *psVar4;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar5;
  pointer pdVar6;
  AlphaVector *this_00;
  AlphaVectorBG *pAVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  Index IVar12;
  size_t sVar13;
  LIndex i;
  ulong uVar14;
  PlanningUnitMADPDiscrete *this_01;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  VectorSet g_baBeta;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  bestG_oa1;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  mask;
  JointPolicyPureVector jpol;
  int local_190;
  undefined1 local_178 [24];
  size_type local_160;
  double *local_158;
  AlphaVector *local_150;
  AlphaVectorBG *local_148;
  JointBeliefInterface *local_140;
  ulong local_138;
  ulong local_130;
  new_allocator<int> local_128 [8];
  size_type local_120;
  int *local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  I_PtPDpure_constPtr local_f8;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_e0;
  JointPolicyPureVector local_c8;
  
  lVar15 = *(long *)(this->_vptr_AlphaVectorBG[-3] + 8 + (long)&(this->_m_bgip).px);
  if (lVar15 == 0) {
    lVar15 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorBG[-3]);
  }
  local_140 = b;
  uVar9 = (**(code **)(**(long **)(lVar15 + 0x30) + 0x68))();
  lVar15 = *(long *)(this->_vptr_AlphaVectorBG[-3] + 8 + (long)&(this->_m_bgip).px);
  if (lVar15 == 0) {
    lVar15 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorBG[-3]);
  }
  uVar10 = (**(code **)(**(long **)(lVar15 + 0x30) + 200))();
  this_01 = *(PlanningUnitMADPDiscrete **)
             (this->_vptr_AlphaVectorBG[-3] + 8 + (long)&(this->_m_bgip).px);
  if (this_01 == (PlanningUnitMADPDiscrete *)0x0) {
    this_01 = *(PlanningUnitMADPDiscrete **)
               (&this->field_0x18 + (long)this->_vptr_AlphaVectorBG[-3]);
  }
  sVar13 = PlanningUnitMADPDiscrete::GetNrStates(this_01);
  lVar15 = *(long *)(this->_vptr_AlphaVectorBG[-3] + 8 + (long)&(this->_m_bgip).px);
  if (lVar15 == 0) {
    lVar15 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorBG[-3]);
  }
  plVar3 = *(long **)(lVar15 + 0x330);
  local_108 = (**(code **)(*(long *)((long)plVar3 + *(long *)(*plVar3 + -0xb0)) + 0x70))
                        ((long)plVar3 + *(long *)(*plVar3 + -0xb0));
  GetMask(&local_e0,this,V);
  local_138 = (ulong)uVar10;
  local_130 = (ulong)uVar9;
  local_120 = local_138 * local_130;
  local_150 = __return_storage_ptr__;
  local_148 = this;
  if (local_120 == 0) {
    local_118 = (int *)0x0;
  }
  else {
    local_118 = __gnu_cxx::new_allocator<int>::allocate(local_128,local_120,(void *)0x0);
  }
  if (uVar10 != 0) {
    uVar14 = 0;
    do {
      if (uVar9 != 0) {
        uVar16 = 0;
        do {
          iVar11 = BeliefValue::GetMaximizingVectorIndex
                             ((BeliefInterface *)
                              ((long)&local_140->field_0x0 + *(long *)((long)*local_140 + -0xb8)),
                              (G->
                              super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                              ).
                              super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                              .base_[(G->
                                     super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                                     ).
                                     super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                                     .origin_offset_ +
                                     (G->
                                     super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                                     ).
                                     super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                                     .stride_list_.elems[0] * (ulong)a +
                                     (G->
                                     super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                                     ).
                                     super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                                     .stride_list_.elems[1] * uVar14],
                              local_e0.
                              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar16);
          local_118[local_130 * uVar14 + uVar16] = iVar11;
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar9);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar10);
  }
  pAVar7 = local_148;
  psVar4 = (local_148->_m_bgip).pn.pi_;
  local_f8.px = (element_type *)(local_148->_m_bgip).px;
  local_f8.pn.pi_ = (local_148->_m_bgip).pn.pi_;
  if (psVar4 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar4->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  JointPolicyPureVector::JointPolicyPureVector(&local_c8,&local_f8);
  boost::detail::shared_count::~shared_count(&local_f8.pn);
  i = Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies
                ((Interface_ProblemToPolicyDiscretePure *)(pAVar7->_m_bgip).px,TYPE_INDEX,999999);
  IVar12 = Globals::CastLIndexToIndex(i);
  local_178._0_8_ = ZEXT48(IVar12);
  local_190 = (int)sVar13;
  local_110 = sVar13 & 0xffffffff;
  local_160 = local_178._0_8_ * local_110;
  local_178._8_8_ = local_110;
  if (local_160 == 0) {
    local_158 = (double *)0x0;
  }
  else {
    local_158 = __gnu_cxx::new_allocator<double>::allocate
                          ((new_allocator<double> *)(local_178 + 0x10),local_160,(void *)0x0);
  }
  if (local_160 != 0) {
    memset(local_158,0,local_160 << 3);
  }
  local_100 = (ulong)uVar10;
  lVar15 = 0;
  bVar8 = false;
  while (bVar8 == false) {
    if (uVar10 != 0) {
      uVar14 = 0;
      do {
        if (local_190 != 0) {
          uVar16 = 0;
          do {
            IVar12 = JPolComponent_VectorImplementation::GetJointActionIndex
                               (&local_c8.super_JPolComponent_VectorImplementation,(Index)uVar14);
            if ((long)local_118[local_130 * uVar14 + (ulong)IVar12] != -1) {
              pmVar5 = (G->
                       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                       ).
                       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                       .base_[(G->
                              super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                              ).
                              super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                              .origin_offset_ +
                              (G->
                              super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                              ).
                              super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                              .stride_list_.elems[0] * (ulong)a +
                              (G->
                              super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                              ).
                              super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                              .stride_list_.elems[1] * uVar14];
              *(double *)((long)local_158 + uVar16 * 8 + local_178._8_8_ * lVar15) =
                   (pmVar5->data_).data_
                   [(long)local_118[local_130 * uVar14 + (ulong)IVar12] * pmVar5->size2_ + uVar16] +
                   *(double *)((long)local_158 + uVar16 * 8 + local_178._8_8_ * lVar15);
            }
            uVar16 = uVar16 + 1;
          } while ((sVar13 & 0xffffffff) != uVar16);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_100);
    }
    lVar15 = lVar15 + 8;
    bVar8 = JPolComponent_VectorImplementation::Increment
                      (&local_c8.super_JPolComponent_VectorImplementation);
  }
  iVar11 = BeliefValue::GetMaximizingVectorIndex
                     ((BeliefInterface *)
                      ((long)&local_140->field_0x0 + *(long *)((long)*local_140 + -0xb8)),
                      (VectorSet *)local_178);
  this_00 = local_150;
  AlphaVector::AlphaVector(local_150,local_110);
  pAVar7 = local_148;
  this_00->_m_action = a;
  AlphaVector::SetBetaI(this_00,(long)iVar11);
  if (local_190 != 0) {
    uVar14 = 0;
    do {
      lVar15 = *(long *)(pAVar7->_vptr_AlphaVectorBG[-3] + 8 + (long)&(pAVar7->_m_bgip).px);
      if (lVar15 == 0) {
        lVar15 = *(long *)(&pAVar7->field_0x18 + (long)pAVar7->_vptr_AlphaVectorBG[-3]);
      }
      uVar16 = (**(code **)(**(long **)(lVar15 + 0x330) + 0xc0))
                         (*(long **)(lVar15 + 0x330),uVar14 & 0xffffffff,a);
      IVar12 = Globals::CastLIndexToIndex((long)iVar11);
      pdVar6 = (this_00->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this_00->_m_values).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar14) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar14);
      }
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_108;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar16;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_158[(ulong)IVar12 * local_178._8_8_ + uVar14];
      auVar2 = vfmadd231sd_fma(auVar18,auVar17,auVar2);
      pdVar6[uVar14] = auVar2._0_8_;
      uVar14 = uVar14 + 1;
    } while (local_190 != (int)uVar14);
  }
  if (local_160 != 0) {
    operator_delete(local_158,local_160 << 3);
  }
  JointPolicyPureVector::~JointPolicyPureVector(&local_c8);
  if (local_120 != 0) {
    operator_delete(local_118,local_120 << 2);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_e0);
  return this_00;
}

Assistant:

AlphaVector
AlphaVectorBG::BeliefBackupExhaustiveStoreAll(const JointBeliefInterface &b,
                                              Index a,
                                              const GaoVectorSet &G,
                                              const 
                                              ValueFunctionPOMDPDiscrete &V)
    const
{
    // Equation numbers refer to PWLC_Dec-POMDPs_b.ps of Nov 7

    unsigned int nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates();
    double gamma=GetPU()->GetDiscount();

    // the mask selects which vectors to consider:
    // mask[jaI][vI] is true <-> vector vI specifies action jaI
    vector<vector<bool> > mask=GetMask(V);

    // given a particular \beta
    //  for all o,   g*_bao\beta = arg max_g^va'_ao \sum_s g^va'_ao(s) * b(s)
    //
    // i.e., we select the g^va'_ao from a set consistent with \beta
    //  (which means that \beta(o) = a') that maximizes the current belief.
    //
    // In this code, however, we do something slightly different namely:
    //
    //  for all o, forall a' 
    //      g*_baoa' =  arg max_g^va'_ao \sum_s g^va'_ao(s) * b(s)
    //
    // I.e., we select the maximizing vector for each possible a'.
    // we store this in bestG_oa1[o][a'].
    boost::numeric::ublas::matrix<int> bestG_oa1(nrO,nrA);

    // (14)
    for(unsigned int o=0;o!=nrO;o++)
        for(unsigned int a1=0;a1!=nrA;++a1)
            bestG_oa1(o,a1)=BeliefValue::GetMaximizingVectorIndex(b,*G[a][o],
                                                                  mask[a1]);

    // now we create a jpol for the induced Bayesian game
    // (i.e. \beta mentioned above, is the policy for a Bayesian game)
    // and use that to combine the bestG_oa1 to g_a-vectors:
    //  g_ba\beta = \sum_o bestG_oa1[o][ \beta(o) ]
    JointPolicyPureVector jpol(_m_bgip);
    Index a1;
    bool round=false;

    VectorSet g_baBeta(CastLIndexToIndex(_m_bgip->GetNrJointPolicies()),nrS);
    g_baBeta.clear();
    int k=-1;

    // (16)
    while (!round) // i.e. forall \beta
    {
        k++;
        for(unsigned int o=0;o!=nrO;o++)
            for(unsigned int s=0;s!=nrS;++s)
            {
                a1=jpol.GetJointActionIndex(o);
                /* following code implements:
                 * VectorSet V=*G[a][o];
                 * int i=bestG_oa1(o,a1);
                 * g_baBeta(k,s)+=V(i,s); // +=V[i][s]; */
                 if(bestG_oa1(o,a1)!=-1)
                     g_baBeta(k,s)+=(*G[a][o])(bestG_oa1(o,a1),s);
            }
        round = ++(jpol);
    }

    AlphaVector::BGPolicyIndex betaMaxI=
        BeliefValue::GetMaximizingVectorIndex(b,g_baBeta);

    double x;
    // create the aplha-vector for b (i.e. add immediate reward)
    AlphaVector newVector(nrS);
    newVector.SetAction(a);
    newVector.SetBetaI(betaMaxI);
    for(unsigned int s=0;s!=nrS;s++)
    {
        // (19)
        x=GetPU()->GetReward(s,a)+gamma*g_baBeta(CastLIndexToIndex(betaMaxI),s);
        newVector.SetValue(x,s);
    }

    return(newVector);
}